

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O0

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t in_RCX;
  size_t in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined1 *__arg;
  Option opt_pack1;
  Mat bottom_blob_unpacked;
  Mat borderm_1;
  Mat m_1;
  int z;
  int q_1;
  Mat bottom_blob_sliced_1;
  size_t out_elemsize_3;
  int out_elempack_3;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  size_t out_elemsize_2;
  int out_elempack_2;
  size_t out_elemsize_1;
  int out_elempack_1;
  size_t out_elemsize;
  int out_elempack;
  int _outc;
  int _outd;
  int _outh;
  int _outw;
  int _coffset;
  int _doffset;
  int _hoffset;
  int _woffset;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *in_stack_fffffffffffffb38;
  Mat *in_stack_fffffffffffffb40;
  Mat *this_00;
  Mat *this_01;
  int *_elemsize;
  int in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  int in_stack_fffffffffffffb60;
  int in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  int iVar4;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb80;
  int *in_stack_fffffffffffffc18;
  int *in_stack_fffffffffffffc20;
  int *in_stack_fffffffffffffc28;
  int *in_stack_fffffffffffffc30;
  Mat *in_stack_fffffffffffffc38;
  Crop *in_stack_fffffffffffffc40;
  int *in_stack_fffffffffffffc50;
  int *in_stack_fffffffffffffc58;
  int *in_stack_fffffffffffffc60;
  int *in_stack_fffffffffffffc68;
  int local_2c0;
  int local_2bc;
  Mat local_2b8;
  undefined1 local_270 [72];
  long local_228;
  int local_21c;
  int local_188;
  undefined4 local_184;
  Mat local_180;
  undefined1 local_138 [24];
  Option *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  Mat *in_stack_fffffffffffffef0;
  Crop *in_stack_fffffffffffffef8;
  int local_6c;
  undefined1 local_68 [8];
  undefined1 local_60 [36];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  size_t local_28;
  size_t local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_38 = *(int *)(in_RSI + 0x38);
  local_3c = *(int *)(in_RSI + 0x28);
  local_60._24_8_ = *(ulong *)(in_RSI + 0x10);
  local_60._20_4_ = *(int *)(in_RSI + 0x18);
  if (local_60._20_4_ != 4) {
LAB_00372526:
    ncnn::Mat::Mat(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    if (local_60._20_4_ != 1) {
      convert_packing(in_stack_fffffffffffffb80,
                      (Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                      in_stack_fffffffffffffb74,
                      (Option *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
    }
    local_4 = Crop::forward(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                            in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    local_184 = 1;
    ncnn::Mat::~Mat((Mat *)0x372626);
    return local_4;
  }
  in_stack_fffffffffffffb80 = (Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18));
  local_28 = in_RCX;
  local_20 = in_RDX;
  ncnn::Mat::shape((Mat *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
  _elemsize = &local_6c;
  this_01 = (Mat *)local_68;
  in_stack_fffffffffffffb40 = (Mat *)(local_68 + 4);
  in_stack_fffffffffffffb38 = (Mat *)local_60;
  __arg = local_60 + 8;
  Crop::resolve_crop_roi
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,
             in_stack_fffffffffffffc50,in_stack_fffffffffffffc58,in_stack_fffffffffffffc60,
             in_stack_fffffffffffffc68);
  ncnn::Mat::~Mat((Mat *)0x371980);
  iVar2 = (int)((ulong)this_01 >> 0x20);
  if (local_3c == 1) {
    iVar3 = 1;
    if ((int)local_60._0_4_ % 4 == 0) {
      iVar3 = 4;
    }
    if (((int)local_60._0_4_ / iVar3 == local_2c) && (iVar3 == 4)) {
      ncnn::Mat::operator=(this_01,in_stack_fffffffffffffb40);
      return 0;
    }
    if (((int)local_60._16_4_ % 4 == 0) && (iVar3 == 4)) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        in_stack_fffffffffffffb5c,(size_t)_elemsize,iVar2,
                        (Allocator *)in_stack_fffffffffffffb40);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb40);
      if (!bVar1) {
        crop_pack4_sse(in_stack_fffffffffffffb80,
                       (Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                       in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
        return 0;
      }
      return -100;
    }
  }
  if (local_3c == 2) {
    iVar3 = 1;
    if ((int)local_68._4_4_ % 4 == 0) {
      iVar3 = 4;
    }
    if (((local_60._0_4_ == local_2c) && ((int)local_68._4_4_ / iVar3 == local_30)) && (iVar3 == 4))
    {
      ncnn::Mat::operator=(this_01,in_stack_fffffffffffffb40);
      return 0;
    }
    if (((int)local_60._12_4_ % 4 == 0) && (iVar3 == 4)) {
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,(size_t)_elemsize,iVar2,
                        (Allocator *)in_stack_fffffffffffffb40);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb40);
      if (!bVar1) {
        crop_pack4_sse(in_stack_fffffffffffffb80,
                       (Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                       in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
        return 0;
      }
      return -100;
    }
  }
  if (local_3c == 3) {
    iVar2 = 1;
    if (local_6c % 4 == 0) {
      iVar2 = 4;
    }
    if (((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) &&
       ((local_6c / iVar2 == local_38 && (iVar2 == 4)))) {
      ncnn::Mat::operator=(this_01,in_stack_fffffffffffffb40);
      return 0;
    }
    if (((int)local_60._4_4_ % 4 == 0) && (iVar2 == 4)) {
      iVar2 = (int)local_60._4_4_ / 4;
      iVar3 = local_6c / 4;
      ncnn::Mat::channel_range
                ((Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                 in_stack_fffffffffffffb64,in_stack_fffffffffffffb60);
      iVar4 = (int)((ulong)_elemsize >> 0x20);
      if ((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) {
        ncnn::Mat::clone(&local_180,(__fn *)local_138,(void *)0x0,iVar3,__arg);
        ncnn::Mat::operator=(this_01,in_stack_fffffffffffffb40);
        ncnn::Mat::~Mat((Mat *)0x371e11);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb40);
        in_stack_fffffffffffffb78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb78);
        if (bVar1) {
          local_4 = -100;
          goto LAB_00372026;
        }
      }
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                        in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,iVar4,(size_t)this_01,
                        (int)((ulong)in_stack_fffffffffffffb40 >> 0x20),
                        (Allocator *)CONCAT44(local_68._4_4_,in_stack_fffffffffffffb70));
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb40);
      iVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb70);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        iVar4 = local_68._4_4_;
        for (local_188 = 0; local_188 < *(int *)(local_20 + 0x38); local_188 = local_188 + 1) {
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                             in_stack_fffffffffffffb64);
          ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68),
                             in_stack_fffffffffffffb64);
          crop_pack4_sse(in_stack_fffffffffffffb80,(Mat *)CONCAT44(iVar2,in_stack_fffffffffffffb78),
                         iVar4,iVar3);
          ncnn::Mat::~Mat((Mat *)0x371fa7);
          ncnn::Mat::~Mat((Mat *)0x371fb4);
        }
        local_4 = 0;
      }
LAB_00372026:
      local_184 = 1;
      ncnn::Mat::~Mat((Mat *)0x372033);
      return local_4;
    }
  }
  if (local_3c != 4) goto LAB_00372526;
  local_21c = 1;
  if (local_6c % 4 == 0) {
    local_21c = 4;
  }
  local_228 = ((ulong)local_60._24_8_ / (ulong)(long)(int)local_60._20_4_) * (long)local_21c;
  if ((((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) &&
      (local_68._0_4_ == local_34)) && ((local_6c / local_21c == local_38 && (local_21c == 4)))) {
    ncnn::Mat::operator=(this_01,in_stack_fffffffffffffb40);
    return 0;
  }
  if (((int)local_60._4_4_ % 4 != 0) || (local_21c != 4)) goto LAB_00372526;
  iVar2 = (int)local_60._4_4_ / 4;
  iVar3 = local_6c / 4;
  ncnn::Mat::channel_range
            ((Mat *)CONCAT44(iVar2,in_stack_fffffffffffffb68),in_stack_fffffffffffffb64,
             in_stack_fffffffffffffb60);
  if (((local_60._0_4_ == local_2c) && (local_68._4_4_ == local_30)) && (local_68._0_4_ == local_34)
     ) {
    ncnn::Mat::clone(&local_2b8,(__fn *)local_270,(void *)0x0,iVar3,__arg);
    ncnn::Mat::operator=(this_01,in_stack_fffffffffffffb40);
    ncnn::Mat::~Mat((Mat *)0x3721fe);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb40);
    in_stack_fffffffffffffb68 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb68);
    if (bVar1) {
      local_4 = -100;
      goto LAB_003724fe;
    }
  }
  this_00 = *(Mat **)(local_28 + 8);
  ncnn::Mat::create((Mat *)CONCAT44(local_68._4_4_,in_stack_fffffffffffffb60),
                    in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58,
                    (int)((ulong)_elemsize >> 0x20),(int)_elemsize,(size_t)this_01,
                    in_stack_fffffffffffffb70,
                    (Allocator *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  bVar1 = ncnn::Mat::empty(this_00);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    iVar3 = local_68._4_4_;
    for (local_2bc = 0; local_2bc < *(int *)(local_20 + 0x38); local_2bc = local_2bc + 1) {
      for (local_2c0 = 0; local_2c0 < (int)local_68._0_4_; local_2c0 = local_2c0 + 1) {
        ncnn::Mat::channel((Mat *)CONCAT44(iVar2,in_stack_fffffffffffffb68),iVar3);
        ncnn::Mat::depth(this_01,(int)((ulong)this_00 >> 0x20));
        ncnn::Mat::~Mat((Mat *)0x3723a3);
        ncnn::Mat::channel((Mat *)CONCAT44(iVar2,in_stack_fffffffffffffb68),iVar3);
        ncnn::Mat::depth(this_01,(int)((ulong)this_00 >> 0x20));
        ncnn::Mat::~Mat((Mat *)0x3723ec);
        crop_pack4_sse(in_stack_fffffffffffffb80,
                       (Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                       in_stack_fffffffffffffb74,in_stack_fffffffffffffb70);
        ncnn::Mat::~Mat((Mat *)0x37241e);
        ncnn::Mat::~Mat((Mat *)0x37242b);
      }
    }
    local_4 = 0;
  }
LAB_003724fe:
  local_184 = 1;
  ncnn::Mat::~Mat((Mat *)0x37250b);
  return local_4;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
#if __AVX__
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
#if __AVX__
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
#if __AVX__
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
#else
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
#endif
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}